

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_exif.cc
# Opt level: O3

string * __thiscall
core::image::anon_unknown_0::debug_print
          (string *__return_storage_ptr__,anon_unknown_0 *this,string *value)

{
  string *extraout_RAX;
  string *extraout_RAX_00;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (value != (string *)0x0) {
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,this,this + (long)&value->_M_dataplus);
    return extraout_RAX;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"<not set>","");
  return extraout_RAX_00;
}

Assistant:

std::string
    debug_print (std::string const& value)
    {
        if (value.empty())
            return "<not set>";
        else
            return value;
    }